

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O0

void __thiscall mailManager::mailManager(mailManager *this,mailSocket *socket)

{
  ostream *this_00;
  mailSocket *socket_local;
  mailManager *this_local;
  
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->map);
  std::__cxx11::list<FILEINFO_*,_std::allocator<FILEINFO_*>_>::list(&this->list);
  if (socket != (mailSocket *)0x0) {
    this->socket = socket;
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,anon_var_dwarf_ae6e);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(-1);
}

Assistant:

mailManager::mailManager(mailSocket *socket) {
    if (socket != nullptr) {
        this->socket = socket;
    } else {
        std::cerr << "mailSocket未初始化" << std::endl;
        exit(-1);
    }
}